

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxVMFunctionCall::Resolve(FxVMFunctionCall *this,FCompileContext *ctx)

{
  PPrototype *pPVar1;
  VMFunction *pVVar2;
  FxExpression *pFVar3;
  bool bVar4;
  FxConstant *type_00;
  FName FVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  Variant *pVVar11;
  Variant *pVVar12;
  PType **ppPVar13;
  char *pcVar14;
  FxExpression **ppFVar15;
  FName *this_00;
  uint *puVar16;
  FxConstant *this_01;
  VMValue *vmval;
  FxTypeCast *this_02;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PPointer *pPVar17;
  TArray<PType_*,_PType_*> *pTVar18;
  TArray<unsigned_int,_unsigned_int> *this_03;
  size_t index;
  PClass *index_00;
  bool bVar19;
  TArray<PType_*,_PType_*> *rets;
  uint flags_1;
  uint flags;
  int numargs;
  bool writable;
  FxExpression *x;
  FxConstant *local_98;
  FxConstant *x_1;
  PType *ntype;
  int k;
  int insert;
  FxNamedNode *old;
  byte local_6d;
  FName name;
  uint uStack_68;
  bool done;
  uint j;
  uint i;
  int flag;
  PType *type;
  bool foundvarargs;
  int implicit;
  TArray<VMValue,_VMValue> *defaults;
  TArray<unsigned_int,_unsigned_int> *argflags;
  TArray<FName,_FName> *argnames;
  TArray<PType_*,_PType_*> *argtypes;
  PPrototype *proto;
  bool failed;
  FCompileContext *ctx_local;
  FxVMFunctionCall *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->Self != (FxExpression *)0x0) {
      if (this->Self != (FxExpression *)0x0) {
        iVar7 = (*this->Self->_vptr_FxExpression[2])(this->Self,ctx);
        this->Self = (FxExpression *)CONCAT44(extraout_var,iVar7);
      }
      if (this->Self == (FxExpression *)0x0) {
        if (this != (FxVMFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
    }
    bVar19 = false;
    pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                        (&this->Function->Variants,0);
    pPVar1 = pVVar11->Proto;
    pTVar18 = &pPVar1->ArgumentTypes;
    pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                        (&this->Function->Variants,0);
    pVVar12 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                        (&this->Function->Variants,0);
    this_03 = &pVVar12->ArgFlags;
    pVVar12 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                        (&this->Function->Variants,0);
    pVVar2 = pVVar12->Implementation;
    uVar8 = PFunction::GetImplicitArgs(this->Function);
    if ((this->Self == (FxExpression *)0x0) &&
       (pVVar12 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                            (&this->Function->Variants,0), (pVVar12->Flags & 2) != 0)) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "Call to non-static function without a self pointer");
      if (this != (FxVMFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxVMFunctionCall *)0x0;
    }
    else {
      uVar9 = TArray<FxExpression_*,_FxExpression_*>::Size
                        (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
      if (uVar9 == 0) {
        uVar9 = TArray<PType_*,_PType_*>::Size(pTVar18);
        if ((uVar8 < uVar9) &&
           (ppPVar13 = TArray<PType_*,_PType_*>::operator[](pTVar18,(long)(int)uVar8),
           *ppPVar13 != (PType *)0x0)) {
          pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                              (&this->Function->Variants,0);
          puVar16 = TArray<unsigned_int,_unsigned_int>::operator[]
                              (&pVVar11->ArgFlags,(long)(int)uVar8);
          if ((*puVar16 & 1) == 0) {
            pcVar14 = FName::GetChars((FName *)&(this->Function->super_PSymbol).super_PTypeBase.
                                                super_DObject.field_0x24);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Insufficient arguments in call to %s",pcVar14);
            if (this != (FxVMFunctionCall *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
      }
      else {
        bVar4 = false;
        _i = (PType *)0x0;
        j = 0;
        ppPVar13 = TArray<PType_*,_PType_*>::Last(pTVar18);
        if (*ppPVar13 != (PType *)0x0) {
          uVar9 = TArray<FxExpression_*,_FxExpression_*>::Size
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
          uVar10 = TArray<PType_*,_PType_*>::Size(pTVar18);
          if (uVar10 < uVar9 + uVar8) {
            pcVar14 = FName::GetChars((FName *)&(this->Function->super_PSymbol).super_PTypeBase.
                                                super_DObject.field_0x24);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Too many arguments in call to %s",pcVar14);
            if (this != (FxVMFunctionCall *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        for (uStack_68 = 0;
            uVar9 = TArray<FxExpression_*,_FxExpression_*>::Size
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>),
            uStack_68 < uVar9; uStack_68 = uStack_68 + 1) {
          if (!bVar4) {
            ppPVar13 = TArray<PType_*,_PType_*>::operator[](pTVar18,(ulong)(uStack_68 + uVar8));
            if (*ppPVar13 == (PType *)0x0) {
              bVar4 = true;
            }
            else {
              ppPVar13 = TArray<PType_*,_PType_*>::operator[](pTVar18,(ulong)(uStack_68 + uVar8));
              _i = *ppPVar13;
              puVar16 = TArray<unsigned_int,_unsigned_int>::operator[]
                                  (this_03,(ulong)(uStack_68 + uVar8));
              j = *puVar16;
            }
          }
          if (_i == (PType *)0x0) {
            __assert_fail("type != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0x1e8c,
                          "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)");
          }
          index = (size_t)uStack_68;
          ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                               (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,index)
          ;
          if ((*ppFVar15)->ExprType == EFX_NamedNode) {
            if ((j & 1) == 0) {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,2,
                         "Cannot use a named argument here - not all required arguments have been passed."
                        );
              if (this != (FxVMFunctionCall *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              return (FxExpression *)0x0;
            }
            if (bVar4) {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,2,
                         "Cannot use a named argument in the varargs part of the parameter list.");
              if (this != (FxVMFunctionCall *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              return (FxExpression *)0x0;
            }
            local_6d = 0;
            ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                 (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                  (ulong)uStack_68);
            FName::FName((FName *)((long)&old + 4),(FName *)(*ppFVar15 + 1));
            name.Index = 0;
LAB_0077694c:
            FVar5.Index = name.Index;
            uVar9 = TArray<FName,_FName>::Size(&pVVar11->ArgNames);
            if ((uint)FVar5.Index < uVar9 - uVar8) {
              this_00 = TArray<FName,_FName>::operator[]
                                  (&pVVar11->ArgNames,(ulong)(name.Index + uVar8));
              bVar6 = FName::operator==(this_00,(FName *)((long)&old + 4));
              if (!bVar6) goto LAB_00776bf9;
              if ((uint)name.Index < uStack_68) {
                pcVar14 = FName::GetChars((FName *)((long)&old + 4));
                FScriptPosition::Message
                          (&(this->super_FxExpression).ScriptPosition,2,
                           "Named argument %s comes before current position in argument list.",
                           pcVar14);
                if (this != (FxVMFunctionCall *)0x0) {
                  (*(this->super_FxExpression)._vptr_FxExpression[1])();
                }
                return (FxExpression *)0x0;
              }
              ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                   (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                    (ulong)uStack_68);
              _k = *ppFVar15;
              pFVar3 = (FxExpression *)_k[1].ScriptPosition.FileName.Chars;
              ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                   (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                    (ulong)uStack_68);
              *ppFVar15 = pFVar3;
              _k[1].ScriptPosition.FileName.Chars = (char *)0x0;
              if (_k != (FxExpression *)0x0) {
                (*_k->_vptr_FxExpression[1])();
              }
              ntype._4_4_ = name.Index - uStack_68;
              for (ntype._0_4_ = 0; (int)ntype < ntype._4_4_; ntype._0_4_ = (int)ntype + 1) {
                ppPVar13 = TArray<PType_*,_PType_*>::operator[]
                                     (pTVar18,(ulong)(uStack_68 + (int)ntype + uVar8));
                x_1 = (FxConstant *)*ppPVar13;
                index_00 = (PClass *)(ulong)(uStack_68 + (int)ntype + uVar8);
                puVar16 = TArray<unsigned_int,_unsigned_int>::operator[](this_03,(size_t)index_00);
                if ((*puVar16 & 0x10000) != 0) {
                  index_00 = PPointer::RegistrationInfo.MyClass;
                  bVar6 = DObject::IsKindOf((DObject *)x_1,PPointer::RegistrationInfo.MyClass);
                  if (!bVar6) {
                    __assert_fail("ntype->IsKindOf(RUNTIME_CLASS(PPointer))",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                                  ,0x1eb6,
                                  "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)"
                                 );
                  }
                  x_1 = (FxConstant *)TypeNullPtr;
                }
                this_01 = (FxConstant *)
                          FxExpression::operator_new((FxExpression *)0x38,(size_t)index_00);
                type_00 = x_1;
                vmval = TArray<VMValue,_VMValue>::operator[]
                                  (&pVVar2->DefaultArgs,(ulong)(uStack_68 + (int)ntype + uVar8));
                FxConstant::FxConstant
                          (this_01,(PType *)type_00,vmval,&(this->super_FxExpression).ScriptPosition
                          );
                x = (FxExpression *)this_01;
                local_98 = this_01;
                TArray<FxExpression_*,_FxExpression_*>::Insert
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                           uStack_68 + (int)ntype,&x);
              }
              local_6d = 1;
            }
            if ((local_6d & 1) == 0) {
              pcVar14 = FName::GetChars((FName *)((long)&old + 4));
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,2,"Named argument %s not found."
                         ,pcVar14);
              if (this != (FxVMFunctionCall *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              return (FxExpression *)0x0;
            }
            ppPVar13 = TArray<PType_*,_PType_*>::operator[](pTVar18,(ulong)(uStack_68 + uVar8));
            _i = *ppPVar13;
            index = (size_t)(uStack_68 + uVar8);
            puVar16 = TArray<unsigned_int,_unsigned_int>::operator[](this_03,index);
            j = *puVar16;
          }
          if ((j & 0x10800) == 0) {
            this_02 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,index);
            ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                 (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                  (ulong)uStack_68);
            FxTypeCast::FxTypeCast(this_02,*ppFVar15,_i,false,false);
            _numargs = this_02;
            iVar7 = (*(this_02->super_FxExpression)._vptr_FxExpression[2])(this_02,ctx);
            _numargs = (FxTypeCast *)CONCAT44(extraout_var_00,iVar7);
          }
          else {
            ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                 (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                  (ulong)uStack_68);
            iVar7 = (*(*ppFVar15)->_vptr_FxExpression[2])(*ppFVar15,ctx);
            ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                 (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                  (ulong)uStack_68);
            *ppFVar15 = (FxExpression *)CONCAT44(extraout_var_01,iVar7);
            ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                 (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                  (ulong)uStack_68);
            if ((*ppFVar15 == (FxExpression *)0x0) ||
               (ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                     (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                      (ulong)uStack_68),
               (PPointer *)(*ppFVar15)->ValueType == TypeNullPtr)) {
              ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                   (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                    (ulong)uStack_68);
              _numargs = (FxTypeCast *)*ppFVar15;
            }
            else {
              ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                   (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                    (ulong)uStack_68);
              (*(*ppFVar15)->_vptr_FxExpression[4])(*ppFVar15,ctx,(long)&flags + 3);
              if ((j & 0x10000) != 0) {
                ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                     (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                      (ulong)uStack_68);
                pPVar17 = NewPointer((*ppFVar15)->ValueType,false);
                ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                     (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                      (ulong)uStack_68);
                (*ppFVar15)->ValueType = (PType *)pPVar17;
              }
              ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                   (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                    (ulong)uStack_68);
              if (_i == (*ppFVar15)->ValueType) {
                ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                     (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                      (ulong)uStack_68);
                _numargs = (FxTypeCast *)*ppFVar15;
              }
              else {
                pcVar14 = FName::GetChars((FName *)&(this->Function->super_PSymbol).super_PTypeBase.
                                                    super_DObject.field_0x24);
                FScriptPosition::Message
                          (&(this->super_FxExpression).ScriptPosition,2,
                           "Type mismatch in reference argument %s",pcVar14);
                _numargs = (FxTypeCast *)0x0;
              }
            }
          }
          pFVar3 = &_numargs->super_FxExpression;
          bVar19 = bVar19 || _numargs == (FxTypeCast *)0x0;
          ppFVar15 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                               (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                (ulong)uStack_68);
          *ppFVar15 = pFVar3;
        }
        uVar9 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
        uVar9 = uVar9 + uVar8;
        uVar8 = TArray<PType_*,_PType_*>::Size(pTVar18);
        if ((uVar9 < uVar8) &&
           (ppPVar13 = TArray<PType_*,_PType_*>::operator[](pTVar18,(long)(int)uVar9),
           *ppPVar13 != (PType *)0x0)) {
          pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                              (&this->Function->Variants,0);
          puVar16 = TArray<unsigned_int,_unsigned_int>::operator[]
                              (&pVVar11->ArgFlags,(long)(int)uVar9);
          if ((*puVar16 & 1) == 0) {
            pcVar14 = FName::GetChars((FName *)&(this->Function->super_PSymbol).super_PTypeBase.
                                                super_DObject.field_0x24);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Insufficient arguments in call to %s",pcVar14);
            if (this != (FxVMFunctionCall *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
      }
      if (bVar19) {
        if (this != (FxVMFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxVMFunctionCall *)0x0;
      }
      else {
        pTVar18 = &pPVar1->ReturnTypes;
        uVar8 = TArray<PType_*,_PType_*>::Size(pTVar18);
        if (uVar8 == 0) {
          (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
        }
        else {
          ppPVar13 = TArray<PType_*,_PType_*>::operator[](pTVar18,0);
          (this->super_FxExpression).ValueType = *ppPVar13;
        }
      }
    }
  }
  return &this_local->super_FxExpression;
LAB_00776bf9:
  name.Index = name.Index + 1;
  goto LAB_0077694c;
}

Assistant:

FxExpression *FxVMFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Self, ctx);
	bool failed = false;
	auto proto = Function->Variants[0].Proto;
	auto &argtypes = proto->ArgumentTypes;
	auto &argnames = Function->Variants[0].ArgNames;
	auto &argflags = Function->Variants[0].ArgFlags;
	auto &defaults = Function->Variants[0].Implementation->DefaultArgs;

	int implicit = Function->GetImplicitArgs();

	// This should never happen.
	if (Self == nullptr && (Function->Variants[0].Flags & VARF_Method))
	{
		ScriptPosition.Message(MSG_ERROR, "Call to non-static function without a self pointer");
		delete this;
		return nullptr;
	}

	if (ArgList.Size() > 0)
	{
		bool foundvarargs = false;
		PType * type = nullptr;
		int flag = 0;
		if (argtypes.Last() != nullptr && ArgList.Size() + implicit > argtypes.Size())
		{
			ScriptPosition.Message(MSG_ERROR, "Too many arguments in call to %s", Function->SymbolName.GetChars());
			delete this;
			return nullptr;
		}

		for (unsigned i = 0; i < ArgList.Size(); i++)
		{
			// Varargs must all have the same type as the last typed argument. A_Jump is the only function using it.
			if (!foundvarargs)
			{
				if (argtypes[i + implicit] == nullptr) foundvarargs = true;
				else
				{
					type = argtypes[i + implicit];
					flag = argflags[i + implicit];
				}
			}
			assert(type != nullptr);

			if (ArgList[i]->ExprType == EFX_NamedNode)
			{
				if (!(flag & VARF_Optional))
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument here - not all required arguments have been passed.");
					delete this;
					return nullptr;
				}
				if (foundvarargs)
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument in the varargs part of the parameter list.");
					delete this;
					return nullptr;
				}
				unsigned j;
				bool done = false;
				FName name = static_cast<FxNamedNode *>(ArgList[i])->name;
				for (j = 0; j < argnames.Size() - implicit; j++)
				{
					if (argnames[j + implicit] == name)
					{
						if (j < i)
						{
							ScriptPosition.Message(MSG_ERROR, "Named argument %s comes before current position in argument list.", name.GetChars());
							delete this;
							return nullptr;
						}
						// copy the original argument into the list
						auto old = static_cast<FxNamedNode *>(ArgList[i]);
						ArgList[i] = old->value; 
						old->value = nullptr;
						delete old;
						// now fill the gap with constants created from the default list so that we got a full list of arguments.
						int insert = j - i;
						for (int k = 0; k < insert; k++)
						{
							auto ntype = argtypes[i + k + implicit];
							// If this is a reference argument, the pointer type must be undone because the code below expects the pointed type as value type.
							if (argflags[i + k + implicit] & VARF_Ref)
							{
								assert(ntype->IsKindOf(RUNTIME_CLASS(PPointer)));
								ntype = TypeNullPtr; // the default of a reference type can only be a null pointer
							}
							auto x = new FxConstant(ntype, defaults[i + k + implicit], ScriptPosition);
							ArgList.Insert(i + k, x);
						}
						done = true;
						break;
					}
				}
				if (!done)
				{
					ScriptPosition.Message(MSG_ERROR, "Named argument %s not found.", name.GetChars());
					delete this;
					return nullptr;
				}
				// re-get the proper info for the inserted node.
				type = argtypes[i + implicit];
				flag = argflags[i + implicit];
			}

			FxExpression *x;
			if (!(flag & (VARF_Ref|VARF_Out)))
			{
				x = new FxTypeCast(ArgList[i], type, false);
				x = x->Resolve(ctx);
			}
			else
			{
				bool writable;
				ArgList[i] = ArgList[i]->Resolve(ctx);	// nust be resolved before the address is requested.
				if (ArgList[i] != nullptr && ArgList[i]->ValueType != TypeNullPtr)
				{
					ArgList[i]->RequestAddress(ctx, &writable);
					if (flag & VARF_Ref) ArgList[i]->ValueType = NewPointer(ArgList[i]->ValueType);
					// For a reference argument the types must match 100%.
					if (type != ArgList[i]->ValueType)
					{
						ScriptPosition.Message(MSG_ERROR, "Type mismatch in reference argument %s", Function->SymbolName.GetChars());
						x = nullptr;
					}
					else
					{
						x = ArgList[i];
					}
				}
				else x = ArgList[i];
			}
			failed |= (x == nullptr);
			ArgList[i] = x;
		}
		int numargs = ArgList.Size() + implicit;
		if ((unsigned)numargs < argtypes.Size() && argtypes[numargs] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[numargs];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	else
	{
		if ((unsigned)implicit < argtypes.Size() && argtypes[implicit] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[implicit];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	if (failed)
	{
		delete this;
		return nullptr;
	}
	TArray<PType *> &rets = proto->ReturnTypes;
	if (rets.Size() > 0)
	{
		ValueType = rets[0];
	}
	else
	{
		ValueType = TypeVoid;
	}
	return this;
}